

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

uint duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<unsigned_long,unsigned_int>
               (unsigned_long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  undefined8 in_RCX;
  VectorTryCastData *data;
  uint output;
  unsigned_long in_stack_00000178;
  VectorTryCastData *in_stack_ffffffffffffff88;
  unsigned_long in_stack_ffffffffffffff90;
  string *idx_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  string *in_stack_ffffffffffffffa0;
  string local_58 [32];
  undefined8 local_38;
  uint local_2c;
  undefined8 local_28;
  uint local_4;
  
  local_28 = in_RCX;
  bVar1 = NumericTryCast::Operation<unsigned_long,unsigned_int>
                    (in_stack_ffffffffffffff90,(uint *)in_stack_ffffffffffffff88,false);
  if (bVar1) {
    local_4 = local_2c;
  }
  else {
    local_38 = local_28;
    idx_00 = local_58;
    CastExceptionText<unsigned_long,unsigned_int>(in_stack_00000178);
    local_4 = HandleVectorCastError::Operation<unsigned_int>
                        (in_stack_ffffffffffffffa0,
                         (ValidityMask *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),(idx_t)idx_00
                         ,in_stack_ffffffffffffff88);
    ::std::__cxx11::string::~string(local_58);
  }
  return local_4;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}